

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid_checker.hpp
# Opt level: O1

void duckdb::ValidChecker::Invalidate<duckdb::MetaTransaction>(MetaTransaction *o,string *error)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ValidChecker *this;
  string local_30;
  
  this = Get(o);
  local_30._M_dataplus._M_p = (error->_M_dataplus)._M_p;
  paVar1 = &error->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p == paVar1) {
    local_30.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_30.field_2._8_8_ = *(undefined8 *)((long)&error->field_2 + 8);
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  }
  else {
    local_30.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_30._M_string_length = error->_M_string_length;
  (error->_M_dataplus)._M_p = (pointer)paVar1;
  error->_M_string_length = 0;
  (error->field_2)._M_local_buf[0] = '\0';
  Invalidate(this,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

static void Invalidate(T &o, string error) {
		Get(o).Invalidate(std::move(error));
	}